

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasMemory(Validator *this,Location *loc,Opcode opcode)

{
  pointer ppMVar1;
  pointer ppMVar2;
  Info local_60;
  Opcode local_34 [2];
  Opcode opcode_local;
  
  ppMVar1 = (this->current_module_->memories).
            super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar2 = (this->current_module_->memories).
            super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar2 == ppMVar1) {
    local_34[0].enum_ = opcode.enum_;
    Opcode::GetInfo(&local_60,local_34);
    PrintError(this,loc,"%s requires an imported or defined memory.",local_60.name);
  }
  return ppMVar2 != ppMVar1;
}

Assistant:

bool Validator::CheckHasMemory(const Location* loc, Opcode opcode) {
  if (current_module_->memories.size() == 0) {
    PrintError(loc, "%s requires an imported or defined memory.",
               opcode.GetName());
    return false;
  }

  return true;
}